

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapistd.c
# Opt level: O0

JDIMENSION jpeg_write_scanlines(j_compress_ptr cinfo,JSAMPARRAY scanlines,JDIMENSION num_lines)

{
  uint uVar1;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  JDIMENSION rows_left;
  JDIMENSION row_ctr;
  JDIMENSION local_18;
  uint local_14;
  undefined8 local_10;
  long *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(int *)((long)in_RDI + 0x24) != 0x65) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(uint *)((long)local_8 + 0x34) <= *(uint *)(local_8 + 0x26)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x7b;
    (**(code **)(*local_8 + 8))(local_8,0xffffffff);
  }
  if (local_8[2] != 0) {
    *(ulong *)(local_8[2] + 8) = (ulong)*(uint *)(local_8 + 0x26);
    *(ulong *)(local_8[2] + 0x10) = (ulong)*(uint *)((long)local_8 + 0x34);
    (**(code **)local_8[2])(local_8);
  }
  if (*(int *)(local_8[0x36] + 0x18) != 0) {
    (**(code **)(local_8[0x36] + 8))(local_8);
  }
  uVar1 = *(int *)((long)local_8 + 0x34) - (int)local_8[0x26];
  if (uVar1 < local_14) {
    local_14 = uVar1;
  }
  local_18 = 0;
  (**(code **)(local_8[0x37] + 8))(local_8,local_10,&local_18,local_14);
  *(JDIMENSION *)(local_8 + 0x26) = local_18 + (int)local_8[0x26];
  return local_18;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_write_scanlines(j_compress_ptr cinfo, JSAMPARRAY scanlines,
                     JDIMENSION num_lines)
{
  JDIMENSION row_ctr, rows_left;

  if (cinfo->global_state != CSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->next_scanline >= cinfo->image_height)
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long)cinfo->next_scanline;
    cinfo->progress->pass_limit = (long)cinfo->image_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
  }

  /* Give master control module another chance if this is first call to
   * jpeg_write_scanlines.  This lets output of the frame/scan headers be
   * delayed so that application can write COM, etc, markers between
   * jpeg_start_compress and jpeg_write_scanlines.
   */
  if (cinfo->master->call_pass_startup)
    (*cinfo->master->pass_startup) (cinfo);

  /* Ignore any extra scanlines at bottom of image. */
  rows_left = cinfo->image_height - cinfo->next_scanline;
  if (num_lines > rows_left)
    num_lines = rows_left;

  row_ctr = 0;
  (*cinfo->main->process_data) (cinfo, scanlines, &row_ctr, num_lines);
  cinfo->next_scanline += row_ctr;
  return row_ctr;
}